

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Chunk * __thiscall Arena::findChunk(Arena *this,size_t size)

{
  Arena *pAVar1;
  Chunk *this_00;
  uint8_t *p;
  Arena *in_RSI;
  undefined8 *in_RDI;
  uint8_t *data;
  void *mem;
  Chunk *ch;
  SQUnsignedInteger in_stack_ffffffffffffffb8;
  Arena *in_stack_ffffffffffffffc0;
  Chunk *local_20;
  
  local_20 = (Chunk *)*in_RDI;
  while( true ) {
    if (local_20 == (Chunk *)0x0) {
      this_00 = (Chunk *)sq_vm_malloc((SQAllocContext)in_stack_ffffffffffffffc0,
                                      in_stack_ffffffffffffffb8);
      p = allocatePage(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      Chunk::Chunk(this_00,(Chunk *)*in_RDI,p,in_RDI[4]);
      *in_RDI = this_00;
      return this_00;
    }
    in_stack_ffffffffffffffc0 = in_RSI;
    pAVar1 = (Arena *)Chunk::left((Chunk *)in_RSI);
    if (in_stack_ffffffffffffffc0 <= pAVar1) break;
    local_20 = local_20->_next;
  }
  return local_20;
}

Assistant:

struct Chunk *findChunk(size_t size) {
        struct Chunk *ch = _chunks;
        while (ch) {
            if (size <= ch->left()) return ch;
            ch = ch->_next;
        }

        void *mem = SQ_MALLOC(_alloc_ctx, sizeof(Chunk));
        uint8_t *data = allocatePage(_chunkSize);
        ch = new(mem) Chunk(_chunks, data, _chunkSize);
        _chunks = ch;
        return ch;
    }